

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_chasm_bin.cpp
# Opt level: O2

void __thiscall FChasmBinFile::DumpFiles(FChasmBinFile *this,char *path)

{
  uint uVar1;
  FResourceLump *pFVar2;
  int iVar3;
  FILE *__stream;
  undefined4 extraout_var;
  size_t __size;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char filename [1024];
  uchar buffer [4096];
  long *plVar4;
  
  CreatePath(path);
  uVar1 = (this->m_lumps).Count;
  uVar7 = 0;
  do {
    if (uVar7 == uVar1) {
      return;
    }
    pFVar2 = (this->m_lumps).Array[uVar7];
    memset(filename,0,0x400);
    mysnprintf(filename,0x400,"%s/%s",path,(pFVar2->FullName).Chars);
    __stream = fopen(filename,"wb");
    if (__stream != (FILE *)0x0) {
      iVar3 = (*pFVar2->_vptr_FResourceLump[2])(pFVar2);
      plVar4 = (long *)CONCAT44(extraout_var,iVar3);
      if (plVar4 == (long *)0x0) {
        __assert_fail("NULL != reader",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/file_chasm_bin.cpp"
                      ,0x1fd,"void FChasmBinFile::DumpFiles(const char *const)");
      }
      for (uVar6 = (ulong)pFVar2->LumpSize; 0 < (long)uVar6; uVar6 = uVar6 - __size) {
        uVar5 = 0x1000;
        if (uVar6 < 0x1000) {
          uVar5 = uVar6;
        }
        __size = (**(code **)(*plVar4 + 0x10))(plVar4,buffer,uVar5);
        fwrite(buffer,__size,1,__stream);
      }
      fclose(__stream);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void FChasmBinFile::DumpFiles(const char* const path)
{
	CreatePath(path);

	for (DWORD i = 0, count = m_lumps.Size(); i < count; ++i)
	{
		FResourceLump* const lump = m_lumps[i];

		char filename[1024] = {};
		mysnprintf(filename, sizeof filename, "%s/%s", path, lump->FullName.GetChars());

		FILE* const file = fopen(filename, "wb");
		if (NULL == file)
		{
			continue;
		}

		FileReader* reader = lump->GetReader();
		assert(NULL != reader);

		for (long bytesLeft = lump->LumpSize; bytesLeft > 0; /* EMPTY */)
		{
			unsigned char buffer[4096];

			const long bytesToRead = MIN(bytesLeft, long(sizeof buffer));
			const long bytesRead = reader->Read(buffer, bytesToRead);

			fwrite(buffer, bytesRead, 1, file);

			bytesLeft -= bytesRead;
		}

		fclose(file);
	}
}